

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void bench_ellswift_setup(void *arg)

{
  int iVar1;
  undefined8 *in_RDI;
  int j;
  bench_ellswift_data *data;
  int i;
  int local_1c;
  int local_c;
  
  memcpy(in_RDI + 0x801,bench_ellswift_setup::init,0x40);
  local_c = 0;
  while( true ) {
    if (0xff < local_c) {
      iVar1 = secp256k1_ellswift_encode
                        (*in_RDI,in_RDI + 0x801,in_RDI + 0x7f9,bench_ellswift_setup::init + 0x10);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ellswift/bench_impl.h"
                ,0x26,
                "test condition failed: secp256k1_ellswift_encode(data->ctx, data->rnd64, &data->point[255], init + 16)"
               );
        abort();
      }
      return;
    }
    iVar1 = secp256k1_ellswift_decode(*in_RDI,in_RDI + (long)local_c * 8 + 1,in_RDI + 0x801);
    if (iVar1 == 0) break;
    for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
      *(char *)((long)in_RDI + (long)local_1c + 0x4008) =
           *(char *)((long)in_RDI + (long)local_1c + 0x4008) + '\x01';
    }
    local_c = local_c + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ellswift/bench_impl.h"
          ,0x21,
          "test condition failed: secp256k1_ellswift_decode(data->ctx, &data->point[i], data->rnd64)"
         );
  abort();
}

Assistant:

static void bench_ellswift_setup(void *arg) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;
    static const unsigned char init[64] = {
        0x78, 0x1f, 0xb7, 0xd4, 0x67, 0x7f, 0x08, 0x68,
        0xdb, 0xe3, 0x1d, 0x7f, 0x1b, 0xb0, 0xf6, 0x9e,
        0x0a, 0x64, 0xca, 0x32, 0x9e, 0xc6, 0x20, 0x79,
        0x03, 0xf3, 0xd0, 0x46, 0x7a, 0x0f, 0xd2, 0x21,
        0xb0, 0x2c, 0x46, 0xd8, 0xba, 0xca, 0x26, 0x4f,
        0x8f, 0x8c, 0xd4, 0xdd, 0x2d, 0x04, 0xbe, 0x30,
        0x48, 0x51, 0x1e, 0xd4, 0x16, 0xfd, 0x42, 0x85,
        0x62, 0xc9, 0x02, 0xf9, 0x89, 0x84, 0xff, 0xdc
    };
    memcpy(data->rnd64, init, 64);
    for (i = 0; i < 256; ++i) {
        int j;
        CHECK(secp256k1_ellswift_decode(data->ctx, &data->point[i], data->rnd64));
        for (j = 0; j < 64; ++j) {
            data->rnd64[j] += 1;
        }
    }
    CHECK(secp256k1_ellswift_encode(data->ctx, data->rnd64, &data->point[255], init + 16));
}